

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_transpose16x4_8x8_sse2(__m128i *x,__m128i *d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  __m128i r7;
  __m128i r6;
  __m128i r5;
  __m128i r4;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m128i r15;
  __m128i r14;
  __m128i r13;
  __m128i r12;
  __m128i r11;
  __m128i r10;
  __m128i r9;
  __m128i r8;
  
  auVar1 = vpunpcklwd_avx(*in_RDI,in_RDI[1]);
  auVar2 = vpunpcklwd_avx(in_RDI[2],in_RDI[3]);
  auVar3 = vpunpcklwd_avx(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpcklwd_avx(in_RDI[6],in_RDI[7]);
  auVar5 = vpunpcklwd_avx(in_RDI[8],in_RDI[9]);
  auVar6 = vpunpcklwd_avx(in_RDI[10],in_RDI[0xb]);
  auVar7 = vpunpcklwd_avx(in_RDI[0xc],in_RDI[0xd]);
  auVar8 = vpunpcklwd_avx(in_RDI[0xe],in_RDI[0xf]);
  auVar9 = vpunpckldq_avx(auVar1,auVar2);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar10 = vpunpckldq_avx(auVar3,auVar4);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  auVar11 = vpunpckldq_avx(auVar5,auVar6);
  auVar3 = vpunpckhdq_avx(auVar5,auVar6);
  auVar5 = vpunpckldq_avx(auVar7,auVar8);
  auVar4 = vpunpckhdq_avx(auVar7,auVar8);
  auVar6 = vpunpcklqdq_avx(auVar9,auVar1);
  auVar1 = vpunpckhqdq_avx(auVar9,auVar1);
  auVar7 = vpunpcklqdq_avx(auVar10,auVar2);
  auVar2 = vpunpckhqdq_avx(auVar10,auVar2);
  auVar8 = vpunpcklqdq_avx(auVar11,auVar3);
  auVar3 = vpunpckhqdq_avx(auVar11,auVar3);
  auVar9 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar4 = vpunpckhqdq_avx(auVar5,auVar4);
  auVar5 = vpunpcklqdq_avx(auVar6,auVar7);
  *in_RSI = auVar5;
  auVar5 = vpunpcklqdq_avx(auVar8,auVar9);
  in_RSI[1] = auVar5;
  auVar5 = vpunpcklqdq_avx(auVar1,auVar2);
  in_RSI[2] = auVar5;
  auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
  in_RSI[3] = auVar5;
  auVar5 = vpunpckhqdq_avx(auVar6,auVar7);
  in_RSI[4] = auVar5;
  auVar5 = vpunpckhqdq_avx(auVar8,auVar9);
  in_RSI[5] = auVar5;
  auVar1 = vpunpckhqdq_avx(auVar1,auVar2);
  in_RSI[6] = auVar1;
  auVar1 = vpunpckhqdq_avx(auVar3,auVar4);
  in_RSI[7] = auVar1;
  return;
}

Assistant:

static inline void highbd_transpose16x4_8x8_sse2(__m128i *x, __m128i *d) {
  __m128i r0, r1, r2, r3, r4, r5, r6, r7, r8, r9, r10, r11, r12, r13, r14, r15;

  r0 = _mm_unpacklo_epi16(x[0], x[1]);
  r1 = _mm_unpacklo_epi16(x[2], x[3]);
  r2 = _mm_unpacklo_epi16(x[4], x[5]);
  r3 = _mm_unpacklo_epi16(x[6], x[7]);

  r4 = _mm_unpacklo_epi16(x[8], x[9]);
  r5 = _mm_unpacklo_epi16(x[10], x[11]);
  r6 = _mm_unpacklo_epi16(x[12], x[13]);
  r7 = _mm_unpacklo_epi16(x[14], x[15]);

  r8 = _mm_unpacklo_epi32(r0, r1);
  r9 = _mm_unpackhi_epi32(r0, r1);
  r10 = _mm_unpacklo_epi32(r2, r3);
  r11 = _mm_unpackhi_epi32(r2, r3);

  r12 = _mm_unpacklo_epi32(r4, r5);
  r13 = _mm_unpackhi_epi32(r4, r5);
  r14 = _mm_unpacklo_epi32(r6, r7);
  r15 = _mm_unpackhi_epi32(r6, r7);

  r0 = _mm_unpacklo_epi64(r8, r9);
  r1 = _mm_unpackhi_epi64(r8, r9);
  r2 = _mm_unpacklo_epi64(r10, r11);
  r3 = _mm_unpackhi_epi64(r10, r11);

  r4 = _mm_unpacklo_epi64(r12, r13);
  r5 = _mm_unpackhi_epi64(r12, r13);
  r6 = _mm_unpacklo_epi64(r14, r15);
  r7 = _mm_unpackhi_epi64(r14, r15);

  d[0] = _mm_unpacklo_epi64(r0, r2);
  d[1] = _mm_unpacklo_epi64(r4, r6);
  d[2] = _mm_unpacklo_epi64(r1, r3);
  d[3] = _mm_unpacklo_epi64(r5, r7);

  d[4] = _mm_unpackhi_epi64(r0, r2);
  d[5] = _mm_unpackhi_epi64(r4, r6);
  d[6] = _mm_unpackhi_epi64(r1, r3);
  d[7] = _mm_unpackhi_epi64(r5, r7);
}